

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexerScanner.cpp
# Opt level: O1

String * __thiscall LexerScanner::readLine(String *__return_storage_ptr__,LexerScanner *this)

{
  char cVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_string).field_2;
  (__return_storage_ptr__->_string)._M_string_length = 0;
  (__return_storage_ptr__->_string).field_2._M_local_buf[0] = '\0';
  while( true ) {
    pcVar2 = this->m_position;
    cVar1 = *pcVar2;
    if (cVar1 == '\r') {
      cVar1 = pcVar2[1];
    }
    if (cVar1 == '\n') break;
    this->m_position = pcVar2 + 1;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

String LexerScanner::readLine()
{
	String line;

    while (*m_position != '\n' && !(*m_position == '\r' && *(m_position+1) == '\n'))
		line += *(m_position++);

	return line;
}